

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

HighsModelStatus __thiscall
presolve::HPresolve::run(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  double rhs;
  size_t sVar1;
  HighsMipSolverData *pHVar2;
  int *piVar3;
  HighsMipSolver *mipsolver;
  uint *puVar4;
  HighsLp *pHVar5;
  pointer Rvalue;
  pointer Rindex;
  pointer piVar6;
  bool integral;
  Result RVar7;
  int iVar8;
  long lVar9;
  int *__args;
  HighsModelStatus HVar10;
  HighsInt row;
  size_type __new_size;
  int iVar11;
  int iVar12;
  size_t sVar13;
  HighsOptions *pHVar14;
  double *pdVar15;
  uint *puVar16;
  int *piVar17;
  vector<double,_std::allocator<double>_> cutvals;
  vector<int,_std::allocator<int>_> cutinds;
  vector<int,_std::allocator<int>_> *__range4;
  
  this->presolve_status_ = kNotSet;
  this->shrinkProblemEnabled = true;
  postsolve_stack->debug_prev_col_upper = 0.0;
  postsolve_stack->debug_prev_row_lower = 0.0;
  postsolve_stack->debug_prev_numreductions = 0;
  postsolve_stack->debug_prev_col_lower = 0.0;
  postsolve_stack->debug_prev_row_upper = 0.0;
  RVar7 = presolve(this,postsolve_stack);
  if (RVar7 == kDualInfeasible) {
    this->presolve_status_ = kUnboundedOrInfeasible;
    pHVar14 = this->options;
    sVar1 = (pHVar14->super_HighsOptionsStruct).presolve._M_string_length;
    if (sVar1 == ::kHighsOffString_abi_cxx11_._M_string_length) {
      if (sVar1 == 0) {
        return kUnboundedOrInfeasible;
      }
      iVar8 = bcmp((pHVar14->super_HighsOptionsStruct).presolve._M_dataplus._M_p,
                   ::kHighsOffString_abi_cxx11_._M_dataplus._M_p,sVar1);
      if (iVar8 == 0) {
        return kUnboundedOrInfeasible;
      }
    }
    sVar13 = this->reductionLimit;
    HVar10 = kUnboundedOrInfeasible;
  }
  else {
    if (RVar7 != kPrimalInfeasible) {
      pHVar14 = this->options;
      sVar1 = (pHVar14->super_HighsOptionsStruct).presolve._M_string_length;
      if (((sVar1 != ::kHighsOffString_abi_cxx11_._M_string_length) ||
          ((sVar1 != 0 &&
           (iVar8 = bcmp((pHVar14->super_HighsOptionsStruct).presolve._M_dataplus._M_p,
                         ::kHighsOffString_abi_cxx11_._M_dataplus._M_p,sVar1), iVar8 != 0)))) &&
         (this->reductionLimit != 0xffffffffffffffff)) {
        highsLogUser(&(pHVar14->super_HighsOptionsStruct).log_options,kInfo,
                     "Presolve performed %ld of %ld permitted reductions\n",
                     (long)(postsolve_stack->reductions).
                           super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(postsolve_stack->reductions).
                           super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
      }
      shrinkProblem(this,postsolve_stack);
      if (this->mipsolver != (HighsMipSolver *)0x0) {
        pHVar2 = (this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        (pHVar2->cliquetable).inPresolve = false;
        (pHVar2->cliquetable).maxEntries =
             ((int)((ulong)((long)(this->Avalue).super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) -
             (int)((ulong)((long)(this->freeslots).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->freeslots).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2)) * 10 + 2000000;
        HighsDomain::addCutpool(&pHVar2->domain,&pHVar2->cutpool);
        pHVar2 = (this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        HighsDomain::addConflictPool(&pHVar2->domain,&pHVar2->conflictPool);
        if (((this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->numRestarts != 0) {
          cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<int,_std::allocator<int>_>::reserve(&cutinds,(long)this->model->num_col_);
          std::vector<double,_std::allocator<double>_>::reserve
                    (&cutvals,(long)this->model->num_col_);
          iVar8 = this->model->num_row_;
          lVar9 = (long)iVar8;
          if (lVar9 < 1) {
            iVar12 = 0;
          }
          else {
            iVar11 = 0;
            do {
              iVar12 = iVar11;
              if ((postsolve_stack->origRowIndex).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar9 + -1] <
                  this->mipsolver->orig_model_->num_row_) break;
              lVar9 = lVar9 + -1;
              row = (HighsInt)lVar9;
              getRowPositions(this,row,&this->rowpositions);
              if (cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
              }
              if (cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
              }
              piVar3 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              for (piVar17 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  piVar6 = cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,
                  Rindex = cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                  Rvalue = cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start, piVar17 != piVar3;
                  piVar17 = piVar17 + 1) {
                iVar12 = *piVar17;
                __args = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + iVar12;
                if (cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&cutinds,
                             (iterator)
                             cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,__args);
                }
                else {
                  *cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = *__args;
                  cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                pdVar15 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start + iVar12;
                if (cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&cutvals,
                             (iterator)
                             cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,pdVar15);
                }
                else {
                  *cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = *pdVar15;
                  cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              mipsolver = this->mipsolver;
              pHVar2 = (mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              rhs = (this->model->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar9];
              if ((this->rowsizeImplInt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar9] +
                  (this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar9] ==
                  (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar9]) {
                integral = rowCoefficientsIntegral(this,row,1.0);
              }
              else {
                integral = false;
              }
              HighsCutPool::addCut
                        (&pHVar2->cutpool,mipsolver,Rindex,Rvalue,
                         (HighsInt)((ulong)((long)piVar6 - (long)Rindex) >> 2),rhs,integral,true,
                         false,false);
              markRowDeleted(this,row);
              puVar4 = (uint *)(this->rowpositions).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
              for (puVar16 = (uint *)(this->rowpositions).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start; puVar16 != puVar4;
                  puVar16 = puVar16 + 1) {
                unlink(this,(char *)(ulong)*puVar16);
              }
              iVar11 = iVar11 + 1;
              iVar12 = iVar8;
            } while (iVar11 != iVar8);
          }
          pHVar5 = this->model;
          __new_size = (long)pHVar5->num_row_ - (long)iVar12;
          pHVar5->num_row_ = (HighsInt)__new_size;
          std::vector<double,_std::allocator<double>_>::resize(&pHVar5->row_lower_,__new_size);
          std::vector<double,_std::allocator<double>_>::resize
                    (&this->model->row_upper_,(long)this->model->num_row_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&this->model->row_names_,(long)this->model->num_row_);
          if (cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(cutvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            operator_delete(cutinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
      }
      pHVar5 = this->model;
      toCSC(this,&(pHVar5->a_matrix_).value_,&(pHVar5->a_matrix_).index_,&(pHVar5->a_matrix_).start_
           );
      pHVar5 = this->model;
      if (pHVar5->num_col_ == 0) {
        if (this->mipsolver == (HighsMipSolver *)0x0) {
          if (pHVar5->num_row_ != 0) {
            this->presolve_status_ = kNotPresolved;
            return kMin;
          }
        }
        else {
          pHVar2 = (this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
          pdVar15 = &pHVar2->upper_limit;
          if (*pdVar15 <= pHVar5->offset_ && pHVar5->offset_ != *pdVar15) {
            this->presolve_status_ = kInfeasible;
            return kInfeasible;
          }
          pHVar2->lower_bound = 0.0;
        }
        this->presolve_status_ = kReducedToEmpty;
        return kOptimal;
      }
      this->presolve_status_ =
           (uint)((postsolve_stack->reductions).
                  super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                 (postsolve_stack->reductions).
                 super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) * 3;
      if (this->mipsolver != (HighsMipSolver *)0x0) {
        return kMin;
      }
      if ((this->options->super_HighsOptionsStruct).use_implied_bounds_from_presolve != true) {
        return kMin;
      }
      setRelaxedImpliedBounds(this);
      return kMin;
    }
    this->presolve_status_ = kInfeasible;
    pHVar14 = this->options;
    sVar1 = (pHVar14->super_HighsOptionsStruct).presolve._M_string_length;
    if (sVar1 == ::kHighsOffString_abi_cxx11_._M_string_length) {
      if (sVar1 == 0) {
        return kInfeasible;
      }
      iVar8 = bcmp((pHVar14->super_HighsOptionsStruct).presolve._M_dataplus._M_p,
                   ::kHighsOffString_abi_cxx11_._M_dataplus._M_p,sVar1);
      if (iVar8 == 0) {
        return kInfeasible;
      }
    }
    sVar13 = this->reductionLimit;
    HVar10 = kInfeasible;
  }
  if (sVar13 != 0xffffffffffffffff) {
    highsLogUser(&(pHVar14->super_HighsOptionsStruct).log_options,kInfo,
                 "Presolve performed %ld of %ld permitted reductions\n",
                 (long)(postsolve_stack->reductions).
                       super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(postsolve_stack->reductions).
                       super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
  }
  return HVar10;
}

Assistant:

HighsModelStatus HPresolve::run(HighsPostsolveStack& postsolve_stack) {
  presolve_status_ = HighsPresolveStatus::kNotSet;
  shrinkProblemEnabled = true;
  postsolve_stack.debug_prev_numreductions = 0;
  postsolve_stack.debug_prev_col_lower = 0;
  postsolve_stack.debug_prev_col_upper = 0;
  postsolve_stack.debug_prev_row_lower = 0;
  postsolve_stack.debug_prev_row_upper = 0;
  // Presolve should only be called with a model that has a non-empty
  // constraint matrix unless it has no rows
  assert(model->a_matrix_.numNz() || model->num_row_ == 0);
  auto reportReductions = [&]() {
    if (options->presolve != kHighsOffString &&
        reductionLimit < kHighsSize_tInf) {
      highsLogUser(options->log_options, HighsLogType::kInfo,
                   "Presolve performed %" PRId64 " of %" PRId64
                   " permitted reductions\n",
                   postsolve_stack.numReductions(), reductionLimit);
    }
  };
  switch (presolve(postsolve_stack)) {
    case Result::kStopped:
    case Result::kOk:
      break;
    case Result::kPrimalInfeasible:
      presolve_status_ = HighsPresolveStatus::kInfeasible;
      reportReductions();
      return HighsModelStatus::kInfeasible;
    case Result::kDualInfeasible:
      presolve_status_ = HighsPresolveStatus::kUnboundedOrInfeasible;
      reportReductions();
      return HighsModelStatus::kUnboundedOrInfeasible;
  }
  reportReductions();

  shrinkProblem(postsolve_stack);

  if (mipsolver != nullptr) {
    mipsolver->mipdata_->cliquetable.setPresolveFlag(false);
    mipsolver->mipdata_->cliquetable.setMaxEntries(numNonzeros());
    mipsolver->mipdata_->domain.addCutpool(mipsolver->mipdata_->cutpool);
    mipsolver->mipdata_->domain.addConflictPool(
        mipsolver->mipdata_->conflictPool);

    if (mipsolver->mipdata_->numRestarts != 0) {
      std::vector<HighsInt> cutinds;
      std::vector<double> cutvals;
      cutinds.reserve(model->num_col_);
      cutvals.reserve(model->num_col_);
      HighsInt numcuts = 0;
      for (HighsInt i = model->num_row_ - 1; i >= 0; --i) {
        // check if we already reached the original rows
        if (postsolve_stack.getOrigRowIndex(i) <
            mipsolver->orig_model_->num_row_)
          break;

        // row is a cut, remove it from matrix but add to cutpool
        ++numcuts;
        storeRow(i);
        cutinds.clear();
        cutvals.clear();
        for (HighsInt j : rowpositions) {
          cutinds.push_back(Acol[j]);
          cutvals.push_back(Avalue[j]);
        }

        mipsolver->mipdata_->cutpool.addCut(
            *mipsolver, cutinds.data(), cutvals.data(), cutinds.size(),
            model->row_upper_[i],
            rowsizeInteger[i] + rowsizeImplInt[i] == rowsize[i] &&
                rowCoefficientsIntegral(i, 1.0),
            true, false, false);

        markRowDeleted(i);
        for (HighsInt j : rowpositions) unlink(j);
      }

      model->num_row_ -= numcuts;
      model->row_lower_.resize(model->num_row_);
      model->row_upper_.resize(model->num_row_);
      model->row_names_.resize(model->num_row_);
    }
  }

  toCSC(model->a_matrix_.value_, model->a_matrix_.index_,
        model->a_matrix_.start_);

  if (model->num_col_ == 0) {
    // Reduced to empty
    if (mipsolver) {
      if (model->offset_ > mipsolver->mipdata_->upper_limit) {
        presolve_status_ = HighsPresolveStatus::kInfeasible;
        return HighsModelStatus::kInfeasible;
      }
      mipsolver->mipdata_->lower_bound = 0;
    } else {
      assert(model->num_row_ == 0);
      if (model->num_row_ != 0) {
        presolve_status_ = HighsPresolveStatus::kNotPresolved;
        return HighsModelStatus::kNotset;
      }
    }
    presolve_status_ = HighsPresolveStatus::kReducedToEmpty;
    return HighsModelStatus::kOptimal;
  } else if (postsolve_stack.numReductions() > 0) {
    // Reductions performed
    presolve_status_ = HighsPresolveStatus::kReduced;
  } else {
    // No reductions performed
    presolve_status_ = HighsPresolveStatus::kNotReduced;
  }

  if (!mipsolver && options->use_implied_bounds_from_presolve)
    setRelaxedImpliedBounds();

  assert(presolve_status_ != HighsPresolveStatus::kNotSet);
  return HighsModelStatus::kNotset;
}